

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O0

bool __thiscall XmlRpc::XmlRpcValue::boolFromXml(XmlRpcValue *this,string *valueXml,int *offset)

{
  long lVar1;
  int *in_RDX;
  undefined4 *in_RDI;
  long ivalue;
  char *valueEnd;
  char *valueStart;
  char *local_30;
  char *local_28;
  int *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  lVar1 = std::__cxx11::string::c_str();
  local_28 = (char *)(lVar1 + *local_20);
  lVar1 = strtol(local_28,&local_30,10);
  if ((local_30 == local_28) || ((lVar1 != 0 && (lVar1 != 1)))) {
    local_1 = false;
  }
  else {
    *in_RDI = 1;
    *(bool *)(in_RDI + 2) = lVar1 == 1;
    *local_20 = ((int)local_30 - (int)local_28) + *local_20;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool XmlRpcValue::boolFromXml(std::string const& valueXml, int* offset)
  {
    const char* valueStart = valueXml.c_str() + *offset;
    char* valueEnd;
    long ivalue = strtol(valueStart, &valueEnd, 10);
    if (valueEnd == valueStart || (ivalue != 0 && ivalue != 1))
      return false;

    _type = TypeBoolean;
    _value.asBool = (ivalue == 1);
    *offset += int(valueEnd - valueStart);
    return true;
  }